

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_1::getNBitIntegerMaxValue(bool isSigned,int numBits)

{
  uint uVar1;
  
  if (numBits == 0) {
    return 0;
  }
  if (isSigned) {
    uVar1 = 0x7fffffff;
    if (numBits < 0x20) {
      uVar1 = ~(-1 << ((byte)numBits - 1 & 0x1f));
    }
    return uVar1;
  }
  uVar1 = ~(-1 << ((byte)numBits & 0x1f));
  if (0x1f < numBits) {
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

int getNBitIntegerMaxValue (bool isSigned, int numBits)
{
	DE_ASSERT(numBits < 32);

	if (numBits == 0)
		return 0;
	else if (isSigned)
		return deIntMaxValue32(numBits);
	else
		return deUintMaxValue32(numBits);
}